

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,JointObservationHistoryTree *joh)

{
  E *this_00;
  
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "GetJointObservationHistoryIndex(JointObservationHistoryTree* joh) seems like a dumb-ass function? I mean looping over exponentially many histories does not seem like a nice thing to do?"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointObservationHistoryIndex(
        JointObservationHistoryTree* joh) const
{
    throw E("GetJointObservationHistoryIndex(JointObservationHistoryTree* joh) seems like a dumb-ass function? I mean looping over exponentially many histories does not seem like a nice thing to do?");

    for(Index i=0;i<_m_nrJointObservationHistories;i++)
    {
        if(_m_jointObservationHistoryTreeVector.at(i)==joh)
            return(i);
    }
    // we should not get here
    throw E("GetJointObservationHistoryIndex index not found");
    return(0);
}